

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dnet::data_types::tensor<int,_3U>::tensor(tensor<int,_3U> *this,array<unsigned_int,_3UL> size)

{
  value_type_conflict1 vVar1;
  iterator pvVar2;
  ulong __n;
  reference pvVar3;
  unsigned_long i;
  iterator iter;
  tensor<int,_3U> *this_local;
  undefined1 local_14 [8];
  array<unsigned_int,_3UL> size_local;
  
  size_local._M_elems[0] = size._M_elems[2];
  local_14 = size._M_elems._0_8_;
  std::vector<int,_std::allocator<int>_>::vector(&this->_data);
  for (i = (unsigned_long)std::array<unsigned_int,_3UL>::begin((array<unsigned_int,_3UL> *)local_14)
      ; pvVar2 = std::array<unsigned_int,_3UL>::end((array<unsigned_int,_3UL> *)local_14),
      (iterator)i != pvVar2; i = i + 4) {
    pvVar2 = std::array<unsigned_int,_3UL>::begin((array<unsigned_int,_3UL> *)local_14);
    __n = (long)(i - (long)pvVar2) >> 2;
    if (2 < __n) break;
    vVar1 = *(value_type_conflict1 *)i;
    pvVar3 = std::array<unsigned_int,_3UL>::operator[](&this->_shape,__n);
    *pvVar3 = vVar1;
  }
  init(this,(EVP_PKEY_CTX *)&this->_shape);
  return;
}

Assistant:

tensor<T, N>::tensor(std::array<index_type, N> size)
        {
            for (auto iter = size.begin(); iter != size.end(); iter++) {
                unsigned long i = iter - size.begin();
                if (i >= N) {
                    break;
                }
                this->_shape[i] = *iter;
            }
            this->init(this->_shape);
        }